

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

macro_t new_macro(c2m_ctx_t c2m_ctx,token_t id,VARR_token_t *params,VARR_token_t *replacement)

{
  pre_ctx *ppVar1;
  VARR_macro_t *pVVar2;
  int iVar3;
  token_t el;
  macro_t __ptr;
  ulong uVar4;
  size_t sVar5;
  macro_t tab_m;
  
  ppVar1 = c2m_ctx->pre_ctx;
  el = (token_t)malloc(0x20);
  *(token_t *)&el->field_0x0 = id;
  (el->pos).fname = (char *)params;
  *(VARR_token_t **)&(el->pos).lno = replacement;
  el->node_code = N_IGNORE;
  iVar3 = HTAB_macro_t_do(ppVar1->macro_tab,(macro_t)el,HTAB_FIND,&tab_m);
  if (iVar3 != 0) {
    __assert_fail("!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x824,"macro_t new_macro(c2m_ctx_t, token_t, VARR_token_t *, VARR_token_t *)");
  }
  HTAB_macro_t_do(ppVar1->macro_tab,(macro_t)el,HTAB_INSERT,&tab_m);
  pVVar2 = ppVar1->macros;
  __ptr = (macro_t)pVVar2->varr;
  if (__ptr != (macro_t)0x0) {
    sVar5 = pVVar2->els_num;
    uVar4 = sVar5 + 1;
    if (pVVar2->size < uVar4) {
      sVar5 = (uVar4 >> 1) + uVar4;
      __ptr = (macro_t)realloc(__ptr,sVar5 * 8);
      pVVar2->varr = (macro_t *)__ptr;
      pVVar2->size = sVar5;
      sVar5 = pVVar2->els_num;
      uVar4 = sVar5 + 1;
    }
    pVVar2->els_num = uVar4;
    (&__ptr->id)[sVar5] = el;
    return __ptr;
  }
  mir_varr_assert_fail("expand","macro_t");
}

Assistant:

static macro_t new_macro (c2m_ctx_t c2m_ctx, token_t id, VARR (token_t) * params,
                          VARR (token_t) * replacement) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_t tab_m, m = malloc (sizeof (struct macro));

  m->id = id;
  m->params = params;
  m->replacement = replacement;
  m->ignore_p = FALSE;
  assert (!HTAB_DO (macro_t, macro_tab, m, HTAB_FIND, tab_m));
  HTAB_DO (macro_t, macro_tab, m, HTAB_INSERT, tab_m);
  VARR_PUSH (macro_t, macros, m);
  return m;
}